

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> __thiscall
wabt::MakeUnique<wabt::ArrayType,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  ArrayType *this_00;
  
  this_00 = (ArrayType *)operator_new(0x78);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  ArrayType::ArrayType(this_00,name);
  *(ArrayType **)this = this_00;
  return (__uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true>)
         (__uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}